

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModportExplicitPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportExplicitPortSyntax,slang::syntax::ModportExplicitPortSyntax_const&>
          (BumpAllocator *this,ModportExplicitPortSyntax *args)

{
  undefined4 uVar1;
  ModportExplicitPortSyntax *pMVar2;
  long lVar3;
  ModportExplicitPortSyntax *pMVar4;
  byte bVar5;
  
  bVar5 = 0;
  pMVar2 = (ModportExplicitPortSyntax *)allocate(this,0x60,8);
  pMVar4 = pMVar2;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_ModportPortSyntax).super_SyntaxNode.field_0x4;
    (pMVar4->super_ModportPortSyntax).super_SyntaxNode.kind =
         (args->super_ModportPortSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pMVar4->super_ModportPortSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (ModportExplicitPortSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pMVar4 = (ModportExplicitPortSyntax *)((long)pMVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pMVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }